

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O0

int check_wsz(skynet_context *ctx,int id,void *buffer,int64_t wsz)

{
  uint32_t destination;
  undefined4 local_48;
  int local_44;
  skynet_socket_message tmp;
  int64_t wsz_local;
  void *buffer_local;
  int id_local;
  skynet_context *ctx_local;
  
  if (wsz < 0) {
    ctx_local._4_4_ = -1;
  }
  else {
    if (0x100000 < wsz) {
      local_48 = 7;
      tmp.type = (int)(wsz / 0x400);
      tmp.ud = 0;
      tmp._12_4_ = 0;
      local_44 = id;
      tmp.buffer = (char *)wsz;
      destination = skynet_context_handle(ctx);
      skynet_send(ctx,0,destination,6,0,&local_48,0x18);
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
check_wsz(struct skynet_context *ctx, int id, void *buffer, int64_t wsz) {
	if (wsz < 0) {
		return -1;
	} else if (wsz > 1024 * 1024) {
		struct skynet_socket_message tmp;
		tmp.type = SKYNET_SOCKET_TYPE_WARNING;
		tmp.id = id;
		tmp.ud = (int)(wsz / 1024);
		tmp.buffer = NULL;
		skynet_send(ctx, 0, skynet_context_handle(ctx), PTYPE_SOCKET, 0 , &tmp, sizeof(tmp));
//		skynet_error(ctx, "%d Mb bytes on socket %d need to send out", (int)(wsz / (1024 * 1024)), id);
	}
	return 0;
}